

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O3

void __thiscall Diligent::ShaderResourceCacheVk::~ShaderResourceCacheVk(ShaderResourceCacheVk *this)

{
  void *pvVar1;
  uint uVar2;
  DescriptorSet *pDVar3;
  ushort uVar4;
  Uint32 Index;
  long *plVar5;
  ulong uVar6;
  
  pvVar1 = (this->m_pMemory)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (pvVar1 != (void *)0x0) {
    uVar4 = this->m_NumSets;
    uVar2 = *(uint *)&this->field_0x1c;
    if ((uVar2 & 0x7fffffff) != 0) {
      plVar5 = (long *)((long)pvVar1 + (ulong)((uint)uVar4 * 0x30) + 8);
      uVar6 = 0;
      do {
        if ((long *)*plVar5 != (long *)0x0) {
          (**(code **)(*(long *)*plVar5 + 0x10))();
          *plVar5 = 0;
          uVar2 = *(uint *)&this->field_0x1c;
        }
        uVar6 = uVar6 + 1;
        plVar5 = plVar5 + 4;
      } while (uVar6 < (uVar2 & 0x7fffffff));
      uVar4 = this->m_NumSets;
    }
    if (uVar4 != 0) {
      Index = 0;
      do {
        pDVar3 = GetDescriptorSet(this,Index);
        DescriptorSetAllocation::Release(&pDVar3->m_DescriptorSetAllocation);
        Index = Index + 1;
      } while (Index < this->m_NumSets);
    }
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&this->m_DbgInitializedResources);
  pvVar1 = (this->m_pMemory)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (pvVar1 != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_pMemory,pvVar1);
  }
  (this->m_pMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  return;
}

Assistant:

ShaderResourceCacheVk::~ShaderResourceCacheVk()
{
    if (m_pMemory)
    {
        Resource* pResources = GetFirstResourcePtr();
        for (Uint32 res = 0; res < m_TotalResources; ++res)
            pResources[res].~Resource();
        for (Uint32 t = 0; t < m_NumSets; ++t)
            GetDescriptorSet(t).~DescriptorSet();
    }
}